

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::toZigZag(LossyDctEncoderBase *this,half *dst,half *src)

{
  long in_RDX;
  long in_RSI;
  int i;
  int remap [64];
  int local_11c;
  int local_118 [64];
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  memcpy(local_118,L"",0x100);
  for (local_11c = 0; local_11c < 0x40; local_11c = local_11c + 1) {
    *(undefined2 *)(local_10 + (long)local_11c * 2) =
         *(undefined2 *)(local_18 + (long)local_118[local_11c] * 2);
  }
  return;
}

Assistant:

void 
DwaCompressor::LossyDctEncoderBase::toZigZag (half *dst, half *src) 
{
    const int remap[] =
    {
         0, 
         1,  8,
        16,  9,  2,
         3, 10, 17, 24,
        32, 25, 18, 11, 4,
         5, 12, 19, 26, 33, 40,
        48, 41, 34, 27, 20, 13, 6,
         7, 14, 21, 28, 35, 42, 49, 56,
            57, 50, 43, 36, 29, 22, 15,
                23, 30, 37, 44, 51, 58,
                    59, 52, 45, 38, 31,
                        39, 46, 53, 60,
                            61, 54, 47,
                                55, 62,
                                    63
    };

    for (int i=0; i<64; ++i)
        dst[i] = src[remap[i]];
}